

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_18d51b::ObjCProtoName::printLeft(ObjCProtoName *this,OutputStream *S)

{
  StringView R;
  StringView R_00;
  
  Node::print(this->Ty,S);
  R.Last = "";
  R.First = "<";
  OutputStream::operator+=(S,R);
  OutputStream::operator+=(S,this->Protocol);
  R_00.Last = "";
  R_00.First = ">";
  OutputStream::operator+=(S,R_00);
  return;
}

Assistant:

void printLeft(OutputStream &S) const override {
    Ty->print(S);
    S += "<";
    S += Protocol;
    S += ">";
  }